

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImU32 ImHash(void *data,int data_size,ImU32 seed)

{
  byte bVar1;
  ImU32 i;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  
  if (ImHash::crc32_lut[1] == 0) {
    uVar3 = 0;
    do {
      iVar7 = 8;
      uVar9 = uVar3 & 0xffffffff;
      do {
        uVar8 = -((uint)uVar9 & 1) & 0xedb88320 ^ (uint)(uVar9 >> 1);
        uVar9 = (ulong)uVar8;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      ImHash::crc32_lut[uVar3] = uVar8;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x100);
  }
  uVar8 = ~seed;
  if (data_size < 1) {
    uVar2 = uVar8;
    if (*data != 0) {
      pcVar6 = (char *)((long)data + 2);
      bVar4 = *data;
      do {
        bVar1 = pcVar6[-1];
        if ((bVar1 == 0x23 && bVar4 == 0x23) && (*pcVar6 == '#')) {
          uVar2 = uVar8;
        }
        uVar2 = uVar2 >> 8 ^ ImHash::crc32_lut[uVar2 & 0xff ^ (uint)bVar4];
        pcVar6 = pcVar6 + 1;
        bVar4 = bVar1;
      } while (bVar1 != 0);
    }
  }
  else {
    lVar5 = 0;
    do {
      uVar8 = uVar8 >> 8 ^ ImHash::crc32_lut[(uint)*(byte *)((long)data + lVar5) ^ uVar8 & 0xff];
      lVar5 = lVar5 + 1;
      uVar2 = uVar8;
    } while (data_size != (int)lVar5);
  }
  return ~uVar2;
}

Assistant:

ImU32 ImHash(const void* data, int data_size, ImU32 seed)
{
    static ImU32 crc32_lut[256] = { 0 };
    if (!crc32_lut[1])
    {
        const ImU32 polynomial = 0xEDB88320;
        for (ImU32 i = 0; i < 256; i++)
        {
            ImU32 crc = i;
            for (ImU32 j = 0; j < 8; j++)
                crc = (crc >> 1) ^ (ImU32(-int(crc & 1)) & polynomial);
            crc32_lut[i] = crc;
        }
    }

    seed = ~seed;
    ImU32 crc = seed;
    const unsigned char* current = (const unsigned char*)data;

    if (data_size > 0)
    {
        // Known size
        while (data_size--)
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ *current++];
    }
    else
    {
        // Zero-terminated string
        while (unsigned char c = *current++)
        {
            // We support a syntax of "label###id" where only "###id" is included in the hash, and only "label" gets displayed.
            // Because this syntax is rarely used we are optimizing for the common case.
            // - If we reach ### in the string we discard the hash so far and reset to the seed.
            // - We don't do 'current += 2; continue;' after handling ### to keep the code smaller.
            if (c == '#' && current[0] == '#' && current[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    return ~crc;
}